

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellReissner4::ChElementShellReissner4(ChElementShellReissner4 *this)

{
  DenseBase<Eigen::Matrix<double,_12,_7,_1,_12,_7>_> *this_00;
  DenseBase<Eigen::Matrix<double,_12,_24,_1,_12,_24>_> *this_01;
  DenseBase<Eigen::Matrix<double,_15,_24,_1,_15,_24>_> *this_02;
  long lVar1;
  DenseBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_> *this_03;
  undefined1 auVar2 [64];
  
  (this->super_ChElementShell).super_ChElementGeneric.Kmatr.super_ChKblock._vptr_ChKblock =
       (_func_int **)&PTR__ChKblockGeneric_01186748;
  (this->super_ChElementShell).super_ChElementGeneric.Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data = (double *)0x0;
  (this->super_ChElementShell).super_ChElementGeneric.Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows = 0;
  (this->super_ChElementShell).super_ChElementGeneric.Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_ChElementShell).super_ChElementGeneric.Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ChElementShell).super_ChElementGeneric.Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_ChElementShell).super_ChElementGeneric.Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_ChElementShell).super_ChElementGeneric.Kmatr.variables.
           super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl
           .super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_ChElementShell).super_ChElementGeneric.Kmatr.variables.
           super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl
           .super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->super_ChElementShell).mass = 0.0;
  (this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase =
       (_func_int **)0x1184c88;
  this->super_ChLoadableUV = (ChLoadableUV)0x1184e58;
  this->super_ChLoadableUVW = (ChLoadableUVW)0x1184f50;
  auVar2 = ZEXT464(0) << 0x40;
  this->m_nodes =
       (vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
        )auVar2._0_24_;
  this->m_layers =
       (vector<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
        )auVar2._24_24_;
  (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar2._48_8_;
  (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auVar2._56_8_;
  *(undefined1 (*) [64])
   &(this->m_nodes).
    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = auVar2;
  *(undefined1 (*) [64])this->xa_0 = auVar2;
  *(undefined1 (*) [64])(this->xa_0[2].m_data + 2) = auVar2;
  *(undefined1 (*) [64])(this->xa[1].m_data + 1) = auVar2;
  *(undefined1 (*) [64])this->phi_tilde_A = auVar2;
  *(undefined1 (*) [64])this->phi_tilde_n = auVar2;
  *(undefined1 (*) [64])(this->phi_tilde_n[2].m_data + 2) = auVar2;
  *(undefined1 (*) [64])(this->phi_tilde_i[1].m_data + 1) = auVar2;
  *(undefined1 (*) [64])(this->phi_tilde_A[2].m_data + 1) = auVar2;
  memset(this->k_1_i,0,0x540);
  this->y_i_1[0].m_data[0] = 0.0;
  this->y_i_1[0].m_data[1] = 0.0;
  this->y_i_1[0].m_data[2] = 0.0;
  this->y_i_1[1].m_data[0] = 0.0;
  this->y_i_1[1].m_data[1] = 0.0;
  this->y_i_1[1].m_data[2] = 0.0;
  this->y_i_1[2].m_data[0] = 0.0;
  this->y_i_1[2].m_data[1] = 0.0;
  this->y_i_1[2].m_data[2] = 0.0;
  this->y_i_1[3].m_data[0] = 0.0;
  this->y_i_1[3].m_data[1] = 0.0;
  this->y_i_1[3].m_data[2] = 0.0;
  this->y_i_2[0].m_data[0] = 0.0;
  this->y_i_2[0].m_data[1] = 0.0;
  this->y_i_2[0].m_data[2] = 0.0;
  this->y_i_2[1].m_data[0] = 0.0;
  this->y_i_2[1].m_data[1] = 0.0;
  this->y_i_2[1].m_data[2] = 0.0;
  this->y_i_2[2].m_data[0] = 0.0;
  this->y_i_2[2].m_data[1] = 0.0;
  this->y_i_2[2].m_data[2] = 0.0;
  this->y_i_2[3].m_data[0] = 0.0;
  this->y_i_2[3].m_data[1] = 0.0;
  this->y_i_2[3].m_data[2] = 0.0;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::resize(&this->m_nodes,4);
  this_03 = (DenseBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_> *)this->L_alpha_beta_i;
  this_01 = (DenseBase<Eigen::Matrix<double,_12,_24,_1,_12,_24>_> *)this->B_overline_i;
  this_02 = (DenseBase<Eigen::Matrix<double,_15,_24,_1,_15,_24>_> *)this->D_overline_i;
  this_00 = (DenseBase<Eigen::Matrix<double,_12,_7,_1,_12,_7>_> *)this->P_i;
  for (lVar1 = -0x1c20; lVar1 != 0; lVar1 = lVar1 + 0x708) {
    Eigen::DenseBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>::setZero(this_03);
    Eigen::DenseBase<Eigen::Matrix<double,_12,_24,_1,_12,_24>_>::setZero(this_01);
    Eigen::DenseBase<Eigen::Matrix<double,_15,_24,_1,_15,_24>_>::setZero(this_02);
    Eigen::DenseBase<Eigen::Matrix<double,_15,_15,_1,_15,_15>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_15,_15,_1,_15,_15>_> *)
               ((long)this->P_i[0].super_PlainObjectBase<Eigen::Matrix<double,_12,_7,_1,_12,_7>_>.
                      m_storage.m_data.array + lVar1));
    Eigen::DenseBase<Eigen::Matrix<double,_12,_7,_1,_12,_7>_>::setZero(this_00);
    this_00 = this_00 + 0x2a0;
    this_02 = this_02 + 0xb40;
    this_01 = this_01 + 0x900;
    this_03 = this_03 + 0x40;
  }
  for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 0x40) {
    Eigen::DenseBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_> *)
               ((long)this->L_alpha_beta_A[0].
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.m_storage.m_data.
                      array + lVar1));
  }
  return;
}

Assistant:

ChElementShellReissner4::ChElementShellReissner4() : tot_thickness(0) {
    m_nodes.resize(4);

    // add here other constructor-time initializations
    for (int i = 0; i < NUMIP; i++) {
        L_alpha_beta_i[i].setZero();
        B_overline_i[i].setZero();
        D_overline_i[i].setZero();
        G_i[i].setZero();
        P_i[i].setZero();
    }

    for (int i = 0; i < NUMSSEP; i++)
        L_alpha_beta_A[i].setZero();
}